

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare
          (DebugInfoManager *this,Instruction *inst)

{
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  DefUseManager *this_00;
  
  CVar2 = Instruction::GetCommonDebugOpcode(inst);
  if (CVar2 == CommonDebugInfoDebugValue) {
    uVar3 = Instruction::GetSingleWordOperand(inst,6);
    pIVar5 = GetDbgInst(this,uVar3);
    if ((pIVar5 != (Instruction *)0x0) &&
       ((int)(((long)(pIVar5->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pIVar5->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) == 5)) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar5,4);
      pIVar5 = GetDbgInst(this,uVar3);
      if (pIVar5 != (Instruction *)0x0) {
        bVar1 = Instruction::IsOpenCL100DebugInstr(inst);
        if (bVar1) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar5,4);
        }
        else {
          uVar3 = GetVulkanDebugOperation(this,pIVar5);
        }
        if (uVar3 == 0) {
          uVar3 = Instruction::GetSingleWordOperand(inst,5);
          if ((this->context_->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            __assert_fail("false && \"Checking a DebugValue can be used for declare needs DefUseManager\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                          ,0x28c,
                          "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(Instruction *)"
                         );
          }
          this_00 = IRContext::get_def_use_mgr(this->context_);
          pIVar5 = DefUseManager::GetDef(this_00,uVar3);
          if ((pIVar5->opcode_ == OpVariable) &&
             (uVar4 = Instruction::GetSingleWordOperand(pIVar5,2), uVar4 == 7)) {
            return uVar3;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

uint32_t DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(
    Instruction* inst) {
  if (inst->GetCommonDebugOpcode() != CommonDebugInfoDebugValue) return 0;

  auto* expr =
      GetDbgInst(inst->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  if (expr == nullptr) return 0;
  if (expr->NumOperands() != kDebugExpressOperandOperationIndex + 1) return 0;

  auto* operation = GetDbgInst(
      expr->GetSingleWordOperand(kDebugExpressOperandOperationIndex));
  if (operation == nullptr) return 0;

  // OpenCL.DebugInfo.100 contains a literal for the operation, Vulkan uses an
  // OpConstant.
  if (inst->IsOpenCL100DebugInstr()) {
    if (operation->GetSingleWordOperand(kDebugOperationOperandOperationIndex) !=
        OpenCLDebugInfo100Deref) {
      return 0;
    }
  } else {
    uint32_t operation_const = GetVulkanDebugOperation(operation);
    if (operation_const != NonSemanticShaderDebugInfo100Deref) {
      return 0;
    }
  }

  uint32_t var_id =
      inst->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
  if (!context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
    assert(false &&
           "Checking a DebugValue can be used for declare needs DefUseManager");
    return 0;
  }

  auto* var = context()->get_def_use_mgr()->GetDef(var_id);
  if (var->opcode() == spv::Op::OpVariable &&
      spv::StorageClass(
          var->GetSingleWordOperand(kOpVariableOperandStorageClassIndex)) ==
          spv::StorageClass::Function) {
    return var_id;
  }
  return 0;
}